

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O2

Comparison __thiscall
Kernel::LiteralComparators::Negative::compare(Negative *this,Literal *l1,Literal *l2)

{
  bool bVar1;
  bool bVar2;
  Comparison CVar3;
  
  bVar1 = LiteralSelector::isNegativeForSelection((this->super_LiteralComparator)._selector,l1);
  bVar2 = LiteralSelector::isNegativeForSelection((this->super_LiteralComparator)._selector,l2);
  CVar3 = GREATER;
  if (!bVar1) {
    CVar3 = -(uint)(byte)(~bVar1 & bVar2);
  }
  if (bVar2) {
    CVar3 = -(uint)(byte)(~bVar1 & bVar2);
  }
  return CVar3;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    ASS(_selector);

    bool l1N=_selector->isNegativeForSelection(l1);
    bool l2N=_selector->isNegativeForSelection(l2);
    if( l1N && !l2N ) {
      return GREATER;
    } else if( !l1N && l2N ) {
      return LESS;
    } else {
      return EQUAL;
    }
  }